

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

double YProbe_at_m(positionTy *posAt,XPLMProbeRef *probeRef)

{
  uint uVar1;
  XPLMProbeRef pvVar2;
  LTError *this;
  long lVar3;
  positionTy *ppVar4;
  undefined1 *puVar5;
  byte bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 in_XMM1_Qa;
  string local_b8;
  undefined4 local_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  positionTy local_68;
  
  uVar7 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  bVar6 = 0;
  if (*probeRef == (XPLMProbeRef)0x0) {
    pvVar2 = (XPLMProbeRef)XPLMCreateProbe(0);
    *probeRef = pvVar2;
    if (pvVar2 == (XPLMProbeRef)0x0) {
      this = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(this,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                       ,0x103,"YProbe_at_m",logFATAL,"ASSERT FAILED: %s","probeRef!=NULL");
      __cxa_throw(this,&LTError::typeinfo,std::logic_error::~logic_error);
    }
  }
  ppVar4 = posAt;
  puVar5 = (undefined1 *)&local_68;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(double *)puVar5 = ppVar4->_lat;
    ppVar4 = (positionTy *)((long)ppVar4 + (ulong)bVar6 * -0x10 + 8);
    puVar5 = puVar5 + ((ulong)bVar6 * -2 + 1) * 8;
  }
  if (NAN(local_68._alt)) {
    local_68._alt = 0.0;
  }
  positionTy::WorldToLocal(&local_68);
  local_80 = 0;
  uStack_78 = 0;
  local_90 = 0;
  uStack_88 = 0;
  local_70 = 0;
  local_94 = 0x2c;
  uVar1 = XPLMProbeTerrainXYZ((float)local_68._lon,CONCAT44(uVar7,(float)local_68._alt),
                              (float)local_68._lat,*probeRef);
  if (uVar1 == 0) {
    local_68._alt = (double)local_90._4_4_;
    local_68._lon._0_4_ = SUB84((double)(float)local_90,0);
    local_68._lat = (double)(float)uStack_88;
    local_68._lon._4_4_ = (int)((ulong)(double)(float)local_90 >> 0x20);
    local_68._ts = NAN;
    local_68._head = NAN;
    local_68._pitch = NAN;
    local_68._roll = NAN;
    local_68.mergeCount = 1;
    local_68.f = (posFlagsTy)0x400;
    local_68.edgeIdx = 0xffffffffffffffff;
    positionTy::LocalToWorld(&local_68);
    uVar7 = SUB84(local_68._alt,0);
    uVar8 = (undefined4)((ulong)local_68._alt >> 0x20);
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    if ((int)dataRefs.iLogLevel < 1) {
      positionTy::dbgTxt_abi_cxx11_(&local_b8,posAt);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
             ,0x115,"YProbe_at_m",logDEBUG,"Y Probe returned %d at %s",(ulong)uVar1,
             local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      uVar7 = 0;
      uVar8 = 0;
    }
  }
  return (double)CONCAT44(uVar8,uVar7);
}

Assistant:

double YProbe_at_m (const positionTy& posAt, XPLMProbeRef& probeRef)
{
    // first call, don't have handle?
    if (!probeRef)
        probeRef = XPLMCreateProbe(xplm_ProbeY);
    LOG_ASSERT(probeRef!=NULL);
    
    // works with local coordinates
    positionTy pos (posAt);
    // next call requires a valid altitude, even if it is just the altitude we want to figure out...
    if (std::isnan(pos.alt_m()))
        pos.alt_m() = 0;
    pos.WorldToLocal();
    
    // let the probe drop...
    XPLMProbeInfo_t probeInfo { sizeof(probeInfo), 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
    XPLMProbeResult res = XPLMProbeTerrainXYZ(probeRef,
                                              (float)pos.X(),
                                              (float)pos.Y(),
                                              (float)pos.Z(),
                                              &probeInfo);
    if (res != xplm_ProbeHitTerrain)
    {
        LOG_MSG(logDEBUG,ERR_Y_PROBE,int(res),posAt.dbgTxt().c_str());
        return 0.0;                 // assume water
    }
    
    // convert to World coordinates and save terrain altitude [in ft]
    pos = positionTy(probeInfo);
    pos.LocalToWorld();
    return pos.alt_m();             // THIS is terrain altitude beneath posAt
}